

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalkExprList(Walker *pWalker,ExprList *p)

{
  int iVar1;
  int iVar2;
  ExprList_item *pEVar3;
  
  if (p != (ExprList *)0x0) {
    pEVar3 = p->a;
    for (iVar2 = p->nExpr; 0 < iVar2; iVar2 = iVar2 + -1) {
      iVar1 = sqlite3WalkExpr(pWalker,pEVar3->pExpr);
      if (iVar1 != 0) {
        return 2;
      }
      pEVar3 = pEVar3 + 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkExprList(Walker *pWalker, ExprList *p){
  int i;
  struct ExprList_item *pItem;
  if( p ){
    for(i=p->nExpr, pItem=p->a; i>0; i--, pItem++){
      if( sqlite3WalkExpr(pWalker, pItem->pExpr) ) return WRC_Abort;
    }
  }
  return WRC_Continue;
}